

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O2

void rb_print(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  for (; node != (lgx_rb_node_t *)0x0; node = node->right) {
    rb_print(rbt,node->left);
    if (rbt->key_type == LGX_RB_KEY_INTEGER) {
      printf("%lld\n",*(undefined8 *)(node->key).buffer);
    }
    printf("%.*s\n",(ulong)(node->key).length,(node->key).buffer);
  }
  return;
}

Assistant:

static void rb_print(lgx_rb_t* rbt, lgx_rb_node_t *node) {
    if (node) {
        rb_print(rbt, node->left);
        switch (rbt->key_type) {
            case LGX_RB_KEY_INTEGER:
                printf("%lld\n", *(long long*)node->key.buffer);
            case LGX_RB_KEY_STRING:
            default:
                printf("%.*s\n", node->key.length, node->key.buffer);
        }
        rb_print(rbt, node->right);
    }
}